

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void * memRealloc(void *buf,size_t count)

{
  size_t in_RSI;
  void *in_RDI;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    memFree((void *)0x11987e);
    local_8 = (void *)0x0;
  }
  else {
    local_8 = realloc(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

void* memRealloc(void* buf, size_t count)
{
	if (count == 0)
	{
		memFree(buf);
		return 0;
	}
#ifdef OS_WIN
	if (!buf)
		return HeapAlloc(GetProcessHeap(), 0, count);
	return HeapReAlloc(GetProcessHeap(), 0, buf, count);
#else
	return realloc(buf, count);
#endif
}